

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  string *def;
  allocator local_51;
  string local_50 [8];
  long local_48;
  
  pcVar2 = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (pcVar2 != (char *)0x0) {
    iVar1 = atoi(pcVar2);
    def = matchVariables_abi_cxx11_;
    for (lVar3 = 0; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
      pcVar2 = GetSafeDefinition(this,def);
      std::__cxx11::string::string(local_50,pcVar2,&local_51);
      if (local_48 != 0) {
        AddDefinition(this,def,"");
        cmState::Snapshot::GetDefinition(&this->StateSnapshot,def);
      }
      std::__cxx11::string::~string(local_50);
      def = def + 1;
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    cmState::Snapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr)
    {
    return;
    }
  int nMatches = atoi(nMatchesStr);
  for (int i=0; i<=nMatches; i++)
    {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if(!s.empty())
      {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
      }
    }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}